

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

char ** VW::get_argv_from_string(string *s,int *argc)

{
  substring s_00;
  vector<substring,_std::allocator<substring>_> *ret;
  char *pcVar1;
  long lVar2;
  char **ppcVar3;
  size_type sVar4;
  reference pvVar5;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  size_t i;
  char **argv;
  vector<substring,_std::allocator<substring>_> foo;
  substring ss;
  char *c;
  size_t in_stack_000000f8;
  vector<substring,_std::allocator<substring>_> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff60;
  undefined1 allow_empty;
  char delim;
  vector<substring,_std::allocator<substring>_> *pvVar6;
  ulong local_78;
  vector<substring,_std::allocator<substring>_> local_40;
  char *local_28;
  char *pcStack_20;
  char *local_18;
  undefined4 *local_10;
  
  delim = (char)((ulong)in_RDI >> 0x38);
  allow_empty = (undefined1)((ulong)in_stack_ffffffffffffff60 >> 0x38);
  local_10 = in_RSI;
  std::__cxx11::string::length();
  local_18 = calloc_or_throw<char>(in_stack_000000f8);
  *local_18 = 'b';
  local_18[1] = ' ';
  ret = (vector<substring,_std::allocator<substring>_> *)(local_18 + 2);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)ret,pcVar1);
  local_28 = local_18;
  pcVar1 = local_18;
  lVar2 = std::__cxx11::string::length();
  pcStack_20 = pcVar1 + lVar2 + 2;
  pvVar6 = &local_40;
  std::vector<substring,_std::allocator<substring>_>::vector
            ((vector<substring,_std::allocator<substring>_> *)0x13a092);
  s_00.end = (char *)pvVar6;
  s_00.begin = pcVar1;
  tokenize<std::vector<substring,std::allocator<substring>>>(delim,s_00,ret,(bool)allow_empty);
  std::vector<substring,_std::allocator<substring>_>::size(&local_40);
  ppcVar3 = calloc_or_throw<char*>(in_stack_000000f8);
  local_78 = 0;
  while( true ) {
    sVar4 = std::vector<substring,_std::allocator<substring>_>::size(&local_40);
    if (sVar4 <= local_78) break;
    in_stack_ffffffffffffff40 = &local_40;
    pvVar5 = std::vector<substring,_std::allocator<substring>_>::operator[]
                       (in_stack_ffffffffffffff40,local_78);
    *pvVar5->end = '\0';
    std::vector<substring,_std::allocator<substring>_>::operator[]
              (in_stack_ffffffffffffff40,local_78);
    std::vector<substring,_std::allocator<substring>_>::operator[]
              (in_stack_ffffffffffffff40,local_78);
    pcVar1 = calloc_or_throw<char>(in_stack_000000f8);
    ppcVar3[local_78] = pcVar1;
    pcVar1 = ppcVar3[local_78];
    pvVar5 = std::vector<substring,_std::allocator<substring>_>::operator[](&local_40,local_78);
    sprintf(pcVar1,"%s",pvVar5->begin);
    local_78 = local_78 + 1;
  }
  sVar4 = std::vector<substring,_std::allocator<substring>_>::size(&local_40);
  *local_10 = (int)sVar4;
  free(local_18);
  std::vector<substring,_std::allocator<substring>_>::~vector(in_stack_ffffffffffffff40);
  return ppcVar3;
}

Assistant:

char** get_argv_from_string(string s, int& argc)
{
  char* c = calloc_or_throw<char>(s.length() + 3);
  c[0] = 'b';
  c[1] = ' ';
  strcpy(c + 2, s.c_str());
  substring ss = {c, c + s.length() + 2};
  std::vector<substring> foo;
  tokenize(' ', ss, foo);

  char** argv = calloc_or_throw<char*>(foo.size());
  for (size_t i = 0; i < foo.size(); i++)
  {
    *(foo[i].end) = '\0';
    argv[i] = calloc_or_throw<char>(foo[i].end - foo[i].begin + 1);
    sprintf(argv[i], "%s", foo[i].begin);
  }

  argc = (int)foo.size();
  free(c);
  return argv;
}